

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O1

WebPMuxError WebPMuxSetAnimationParams(WebPMux *mux,WebPMuxAnimParams *params)

{
  WebPMuxError WVar1;
  uint8_t data [6];
  WebPData anim;
  uint32_t local_2e;
  undefined2 local_2a;
  WebPData local_28;
  
  local_28.bytes = (uint8_t *)&local_2e;
  local_28.size = 6;
  WVar1 = WEBP_MUX_INVALID_ARGUMENT;
  if ((params != (WebPMuxAnimParams *)0x0 && mux != (WebPMux *)0x0) &&
     ((uint)params->loop_count < 0x10000)) {
    WVar1 = MuxDeleteAllNamedData(mux,0x4d494e41);
    if ((uint)WVar1 < 2) {
      local_2e = params->bgcolor;
      local_2a = (undefined2)params->loop_count;
      WVar1 = MuxSet(mux,0x4d494e41,&local_28,1);
    }
  }
  return WVar1;
}

Assistant:

WebPMuxError WebPMuxSetAnimationParams(WebPMux* mux,
                                       const WebPMuxAnimParams* params) {
  WebPMuxError err;
  uint8_t data[ANIM_CHUNK_SIZE];
  const WebPData anim = { data, ANIM_CHUNK_SIZE };

  if (mux == NULL || params == NULL) return WEBP_MUX_INVALID_ARGUMENT;
  if (params->loop_count < 0 || params->loop_count >= MAX_LOOP_COUNT) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  // Delete any existing ANIM chunk(s).
  err = MuxDeleteAllNamedData(mux, kChunks[IDX_ANIM].tag);
  if (err != WEBP_MUX_OK && err != WEBP_MUX_NOT_FOUND) return err;

  // Set the animation parameters.
  PutLE32(data, params->bgcolor);
  PutLE16(data + 4, params->loop_count);
  return MuxSet(mux, kChunks[IDX_ANIM].tag, &anim, 1);
}